

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O2

void finish(cbify *data)

{
  cbify_adf_data *this;
  size_t a;
  ulong uVar1;
  
  (*(code *)PTR_delete_label_002aab88)();
  v_array<ACTION_SCORE::action_score>::delete_v(&data->a_s);
  if (data->use_adf == true) {
    this = &data->adf_data;
    for (uVar1 = 0; uVar1 < (data->adf_data).num_actions; uVar1 = uVar1 + 1) {
      v_array<ACTION_SCORE::action_score>::delete_v
                ((v_array<ACTION_SCORE::action_score> *)
                 &((this->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar1]->pred).scalars);
      VW::dealloc_example((_func_void_void_ptr *)PTR_delete_label_002aab88,
                          (this->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar1],(_func_void_void_ptr *)0x0
                         );
      free((this->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar1]);
    }
    std::_Vector_base<example_*,_std::allocator<example_*>_>::~_Vector_base
              ((_Vector_base<example_*,_std::allocator<example_*>_> *)this);
    return;
  }
  return;
}

Assistant:

void finish(cbify& data)
{
  CB::cb_label.delete_label(&data.cb_label);
  data.a_s.delete_v();
  if (data.use_adf)
  {
    for (size_t a = 0; a < data.adf_data.num_actions; ++a)
    {
      data.adf_data.ecs[a]->pred.a_s.delete_v();
      VW::dealloc_example(CB::cb_label.delete_label, *data.adf_data.ecs[a]);
      free_it(data.adf_data.ecs[a]);
    }
    data.adf_data.ecs.~vector<example*>();
  }
}